

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O1

void ht_feature_cached_string_push_map(HT_Timeline *timeline)

{
  HT_Feature *pHVar1;
  
  pHVar1 = ht_timeline_get_feature
                     (timeline,(HT_FeatureKlass *)HT_FeatureCachedString_get_class_feature_klass);
  if (pHVar1 == (HT_Feature *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/feature_cached_string.c"
                  ,0x9c,"void ht_feature_cached_string_push_map(HT_Timeline *)");
  }
  if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
    ht_mutex_lock((HT_Mutex *)pHVar1[1].klass);
  }
  ht_hash_map_for_each((HT_HashMap *)(pHVar1 + 0x1002),ht_feature_cached_string_push_event,timeline)
  ;
  ht_hash_map_for_each((HT_HashMap *)(pHVar1 + 2),ht_feature_cached_string_push_event,timeline);
  if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
    ht_mutex_unlock((HT_Mutex *)pHVar1[1].klass);
    return;
  }
  return;
}

Assistant:

void
ht_feature_cached_string_push_map(HT_Timeline* timeline)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);

    assert(f);

    HT_FCS_LOCK_(f);

    ht_hash_map_for_each(&f->static_hashes, ht_feature_cached_string_push_event, timeline);
    ht_hash_map_for_each(&f->dynamic_hashes, ht_feature_cached_string_push_event, timeline);

    HT_FCS_UNLOCK_(f);
}